

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *piVar1;
  undefined8 *puVar2;
  U32 UVar3;
  ZSTD_matchState_t *pZVar4;
  U32 *pUVar5;
  seqDef *psVar6;
  char cVar7;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  byte bVar14;
  BYTE *pBVar15;
  uint uVar16;
  ulong uVar17;
  BYTE *pBVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  int *piVar23;
  ulong uVar24;
  ulong uVar25;
  int *piVar26;
  long lVar27;
  int *piVar28;
  uint uVar29;
  BYTE *pBVar30;
  int *piVar31;
  size_t offbaseFound;
  size_t local_c8;
  int *local_c0;
  int *local_b8;
  uint local_ac;
  ulong local_a8;
  int *local_a0;
  uint local_94;
  BYTE *local_90;
  ulong local_88;
  int *local_80;
  ulong local_78;
  int *local_70;
  BYTE *local_68;
  uint local_5c;
  BYTE *local_58;
  BYTE *local_50;
  uint *local_48;
  BYTE *local_40;
  ulong local_38;
  
  pBVar30 = (ms->window).base;
  local_94 = (ms->cParams).minMatch;
  if (5 < local_94) {
    local_94 = 6;
  }
  if (local_94 < 5) {
    local_94 = 4;
  }
  local_ac = (ms->cParams).searchLog;
  uVar21 = 6;
  if (local_ac < 6) {
    uVar21 = local_ac;
  }
  uVar11 = (ms->window).dictLimit;
  uVar25 = (ulong)uVar11;
  if (uVar21 < 5) {
    uVar21 = 4;
  }
  local_68 = pBVar30 + uVar25;
  pZVar4 = ms->dictMatchState;
  local_58 = (pZVar4->window).base;
  local_40 = local_58 + (pZVar4->window).dictLimit;
  local_70 = (int *)(pZVar4->window).nextSrc;
  uVar10 = ((int)src - ((int)local_40 + (int)local_68)) + (int)local_70;
  piVar31 = (int *)((long)src + (ulong)(uVar10 == 0));
  uVar12 = *rep;
  if (uVar10 < uVar12) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar20 = rep[1];
  local_a8 = uVar25;
  local_48 = rep;
  if (uVar10 < uVar20) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  piVar26 = (int *)((long)src + (srcSize - 0x10));
  ms->lazySkipping = 0;
  uVar10 = ms->nextToUpdate;
  uVar22 = (ulong)uVar10;
  uVar16 = ((int)piVar26 - (int)(pBVar30 + uVar22)) + 1;
  uVar19 = 8;
  if (uVar16 < 8) {
    uVar19 = uVar16;
  }
  if (piVar26 < pBVar30 + uVar22) {
    uVar19 = 0;
  }
  bVar14 = (byte)uVar21;
  local_c0 = (int *)src;
  local_a0 = piVar26;
  if (uVar10 < uVar19 + uVar10) {
    UVar3 = ms->rowHashLog;
    local_b8 = (int *)srcSize;
    if (0x20 < UVar3 + 8) {
LAB_0017f8fe:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar5 = ms->hashTable;
    pBVar18 = ms->tagTable;
    uVar24 = ms->hashSalt;
    local_78 = (ulong)(0x38 - UVar3);
    local_90 = (BYTE *)CONCAT44(local_90._4_4_,0x18 - UVar3);
    local_80 = (int *)0xcf1bbcdcbf9b0000;
    do {
      if (local_94 == 5) {
        uVar17 = *(long *)(pBVar30 + uVar22) * -0x30e4432345000000;
LAB_0017efaf:
        uVar16 = (uint)((uVar17 ^ uVar24) >> ((byte)(0x38 - UVar3) & 0x3f));
      }
      else {
        if (local_94 == 6) {
          uVar17 = *(long *)(pBVar30 + uVar22) * -0x30e4432340650000;
          goto LAB_0017efaf;
        }
        uVar16 = (*(int *)(pBVar30 + uVar22) * -0x61c8864f ^ (uint)uVar24) >>
                 ((byte)(0x18 - UVar3) & 0x1f);
      }
      uVar29 = (uVar16 >> 8) << (bVar14 & 0x1f);
      if (((ulong)(pUVar5 + uVar29) & 0x3f) != 0) {
LAB_0017f7e7:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar18 + uVar29) & ~(-1L << (bVar14 & 0x3f))) != 0) {
LAB_0017f806:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar22 & 7] = uVar16;
      uVar22 = uVar22 + 1;
    } while (uVar19 + uVar10 != uVar22);
  }
  piVar28 = (int *)(srcSize + (long)src);
  if (piVar31 < piVar26) {
    local_5c = ((int)local_58 - (int)local_70) + uVar11;
    local_90 = local_58 + -(ulong)local_5c;
    local_80 = piVar28 + -8;
    local_78 = ~(-1L << (bVar14 & 0x3f));
    local_b8 = piVar28;
    local_50 = pBVar30;
    do {
      piVar1 = (int *)((long)piVar31 + 1);
      uVar11 = (((int)piVar31 - (int)pBVar30) - uVar12) + 1;
      uVar10 = (uint)uVar25;
      piVar23 = (int *)(pBVar30 + uVar11);
      if (uVar11 < uVar10) {
        piVar23 = (int *)(local_58 + (uVar11 - local_5c));
      }
      bVar9 = true;
      if ((uVar11 - uVar10 < 0xfffffffd) && (*piVar23 == *piVar1)) {
        piVar26 = piVar28;
        if (uVar11 < uVar10) {
          piVar26 = local_70;
        }
        sVar13 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar31 + 5),(BYTE *)(piVar23 + 1),(BYTE *)piVar28,
                            (BYTE *)piVar26,local_68);
        uVar22 = sVar13 + 4;
        bVar9 = false;
        uVar25 = local_a8;
        piVar26 = local_a0;
        piVar28 = local_b8;
        pBVar30 = local_50;
      }
      else {
        uVar22 = 0;
      }
      uVar24 = 1;
      uVar11 = uVar12;
      local_c0 = piVar1;
      if (bVar9) {
        local_c8 = 999999999;
        local_88 = uVar22;
        if (local_94 == 6) {
          if (uVar21 == 6) {
            uVar22 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                               (ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_c8);
          }
          else if (uVar21 == 5) {
            uVar22 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                               (ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_c8);
          }
          else {
            uVar22 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                               (ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_c8);
          }
        }
        else if (local_94 == 5) {
          if (uVar21 == 6) {
            uVar22 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                               (ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_c8);
          }
          else if (uVar21 == 5) {
            uVar22 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                               (ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_c8);
          }
          else {
            uVar22 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                               (ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_c8);
          }
        }
        else if (uVar21 == 6) {
          uVar22 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                             (ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_c8);
        }
        else if (uVar21 == 5) {
          uVar22 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                             (ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_c8);
        }
        else {
          uVar22 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                             (ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_c8);
        }
        uVar24 = local_c8;
        piVar26 = piVar31;
        if (uVar22 <= local_88) {
          uVar22 = local_88;
          uVar24 = 1;
          piVar26 = local_c0;
        }
        local_c0 = piVar26;
        uVar25 = local_a8;
        piVar26 = local_a0;
        piVar28 = local_b8;
        if (3 < uVar22) {
          if (3 < uVar24) {
            uVar17 = (long)local_c0 + (-(long)pBVar30 - uVar24) + -0xfffffffd;
            pBVar15 = pBVar30;
            pBVar18 = local_68;
            if ((uint)uVar17 < (uint)local_a8) {
              pBVar15 = local_90;
              pBVar18 = local_40;
            }
            if ((src < local_c0) && (uVar17 = uVar17 & 0xffffffff, pBVar18 < pBVar15 + uVar17)) {
              pBVar15 = pBVar15 + uVar17;
              do {
                piVar31 = (int *)((long)local_c0 + -1);
                pBVar15 = pBVar15 + -1;
                if ((*(BYTE *)piVar31 != *pBVar15) ||
                   (uVar22 = uVar22 + 1, local_c0 = piVar31, piVar31 <= src)) break;
              } while (pBVar18 < pBVar15);
            }
            uVar11 = (int)uVar24 - 3;
            uVar20 = uVar12;
          }
          goto LAB_0017f387;
        }
        uVar22 = (long)piVar31 - (long)src;
        piVar31 = (int *)((long)piVar31 + (uVar22 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar22);
      }
      else {
LAB_0017f387:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0017f825:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_88 = uVar22;
        if (0x20000 < seqStore->maxNbLit) {
LAB_0017f863:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar22 = (long)local_c0 - (long)src;
        pBVar18 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar18 + uVar22) {
LAB_0017f8a1:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (piVar28 < local_c0) {
LAB_0017f844:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_38 = uVar24;
        if (local_80 < local_c0) {
          ZSTD_safecopyLiterals(pBVar18,(BYTE *)src,(BYTE *)local_c0,(BYTE *)local_80);
          uVar25 = local_a8;
          piVar26 = local_a0;
          piVar28 = local_b8;
        }
        else {
          uVar8 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar18 = *src;
          *(undefined8 *)(pBVar18 + 8) = uVar8;
          if (0x10 < uVar22) {
            pBVar18 = seqStore->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar18 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar8 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar18 + 0x18) = uVar8;
            if (0x20 < (long)uVar22) {
              lVar27 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
                uVar8 = puVar2[1];
                pBVar15 = pBVar18 + lVar27 + 0x20;
                *(undefined8 *)pBVar15 = *puVar2;
                *(undefined8 *)(pBVar15 + 8) = uVar8;
                puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
                uVar8 = puVar2[1];
                *(undefined8 *)(pBVar15 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar15 + 0x18) = uVar8;
                lVar27 = lVar27 + 0x20;
              } while (pBVar15 + 0x20 < pBVar18 + uVar22);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar6 = seqStore->sequences;
        psVar6->litLength = (U16)uVar22;
        psVar6->offBase = (U32)local_38;
        if (local_88 < 3) {
LAB_0017f882:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < local_88 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0017f8c0:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar6 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar6->mlBase = (U16)(local_88 - 3);
        seqStore->sequences = psVar6 + 1;
        if (ms->lazySkipping != 0) {
          uVar12 = ms->nextToUpdate;
          uVar25 = (ulong)uVar12;
          uVar10 = ((int)piVar26 - (int)(pBVar30 + uVar25)) + 1;
          if (7 < uVar10) {
            uVar10 = 8;
          }
          if (piVar26 < pBVar30 + uVar25) {
            uVar10 = 0;
          }
          if (uVar12 < uVar10 + uVar12) {
            if (0x20 < ms->rowHashLog + 8) goto LAB_0017f8fe;
            pUVar5 = ms->hashTable;
            pBVar18 = ms->tagTable;
            uVar22 = ms->hashSalt;
            cVar7 = (char)ms->rowHashLog;
            do {
              if (local_94 == 5) {
                uVar24 = *(long *)(pBVar30 + uVar25) * -0x30e4432345000000;
LAB_0017f59c:
                uVar24 = (uVar24 ^ uVar22) >> (0x38U - cVar7 & 0x3f);
              }
              else {
                if (local_94 == 6) {
                  uVar24 = *(long *)(pBVar30 + uVar25) * -0x30e4432340650000;
                  goto LAB_0017f59c;
                }
                uVar24 = (ulong)((*(int *)(pBVar30 + uVar25) * -0x61c8864f ^ (uint)uVar22) >>
                                (0x18U - cVar7 & 0x1f));
              }
              uVar19 = ((uint)(uVar24 >> 8) & 0xffffff) << (bVar14 & 0x1f);
              if (((ulong)(pUVar5 + uVar19) & 0x3f) != 0) goto LAB_0017f7e7;
              if ((local_78 & (ulong)(pBVar18 + uVar19)) != 0) goto LAB_0017f806;
              ms->hashCache[(uint)uVar25 & 7] = (U32)uVar24;
              uVar25 = uVar25 + 1;
            } while (uVar10 + uVar12 != uVar25);
          }
          ms->lazySkipping = 0;
          uVar25 = local_a8;
          piVar26 = local_a0;
          piVar28 = local_b8;
        }
        src = (void *)((long)local_c0 + local_88);
        pBVar18 = local_90;
        piVar31 = (int *)src;
        do {
          uVar12 = uVar11;
          if (piVar26 < piVar31) break;
          uVar12 = ((int)piVar31 - (int)pBVar30) - uVar20;
          uVar10 = (uint)uVar25;
          pBVar15 = pBVar30;
          if (uVar12 < uVar10) {
            pBVar15 = pBVar18;
          }
          if ((uVar12 - uVar10 < 0xfffffffd) && (*(int *)(pBVar15 + uVar12) == *piVar31)) {
            piVar26 = piVar28;
            if (uVar12 < uVar10) {
              piVar26 = local_70;
            }
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(piVar31 + 1),(BYTE *)((long)(pBVar15 + uVar12) + 4),
                                (BYTE *)piVar28,(BYTE *)piVar26,local_68);
            pBVar30 = local_50;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0017f825;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0017f863;
            pBVar18 = seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < pBVar18) goto LAB_0017f8a1;
            if (local_b8 < src) goto LAB_0017f844;
            if (local_80 < src) {
              ZSTD_safecopyLiterals(pBVar18,(BYTE *)src,(BYTE *)src,(BYTE *)local_80);
            }
            else {
              uVar8 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar18 = *src;
              *(undefined8 *)(pBVar18 + 8) = uVar8;
            }
            psVar6 = seqStore->sequences;
            psVar6->litLength = 0;
            psVar6->offBase = 1;
            if (sVar13 + 4 < 3) goto LAB_0017f882;
            if (0xffff < sVar13 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0017f8c0;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar6 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar6->mlBase = (U16)(sVar13 + 1);
            seqStore->sequences = psVar6 + 1;
            src = (void *)((long)piVar31 + sVar13 + 4);
            bVar9 = true;
            pBVar18 = local_90;
            uVar25 = local_a8;
            piVar26 = local_a0;
            piVar28 = local_b8;
            piVar31 = (int *)src;
            uVar12 = uVar11;
            uVar11 = uVar20;
          }
          else {
            bVar9 = false;
            uVar12 = uVar20;
          }
          uVar20 = uVar12;
          uVar12 = uVar11;
        } while (bVar9);
      }
    } while (piVar31 < piVar26);
  }
  *local_48 = uVar12;
  local_48[1] = uVar20;
  return (long)piVar28 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_dictMatchState);
}